

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O3

void __thiscall
HTTPRequest::WriteReply
          (HTTPRequest *this,int nStatus,span<const_std::byte,_18446744073709551615UL> reply)

{
  evhttp_request *peVar1;
  bool bVar2;
  long lVar3;
  HTTPEvent *this_00;
  long in_FS_OFFSET;
  string local_78;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->replySent != false) || (this->req == (evhttp_request *)0x0)) {
    __assert_fail("!replySent && req",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
                  ,0x286,"void HTTPRequest::WriteReply(int, std::span<const std::byte>)");
  }
  bVar2 = util::SignalInterrupt::operator_cast_to_bool(this->m_interrupt);
  if (bVar2) {
    local_58._M_unused._M_object = &local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Connection","");
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"close","");
    WriteHeader(this,(string *)&local_58,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((code **)local_58._M_unused._0_8_ != &local_48) {
      operator_delete(local_58._M_unused._M_object,(ulong)(local_48 + 1));
    }
  }
  lVar3 = evhttp_request_get_output_buffer(this->req);
  if (lVar3 != 0) {
    evbuffer_add(lVar3,reply._M_ptr,reply._M_extent._M_extent_value._M_extent_value);
    peVar1 = this->req;
    this_00 = (HTTPEvent *)operator_new(0x30);
    local_58._12_4_ = 0;
    local_58._8_4_ = nStatus;
    local_40 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp:655:52)>
               ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp:655:52)>
               ::_M_manager;
    local_58._M_unused._M_object = peVar1;
    HTTPEvent::HTTPEvent(this_00,eventBase,true,(function<void_()> *)&local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,3);
    }
    event_active(this_00->ev,0,0);
    this->replySent = true;
    this->req = (evhttp_request *)0x0;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("evb",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
                ,0x28c,"void HTTPRequest::WriteReply(int, std::span<const std::byte>)");
}

Assistant:

void HTTPRequest::WriteReply(int nStatus, std::span<const std::byte> reply)
{
    assert(!replySent && req);
    if (m_interrupt) {
        WriteHeader("Connection", "close");
    }
    // Send event to main http thread to send reply message
    struct evbuffer* evb = evhttp_request_get_output_buffer(req);
    assert(evb);
    evbuffer_add(evb, reply.data(), reply.size());
    auto req_copy = req;
    HTTPEvent* ev = new HTTPEvent(eventBase, true, [req_copy, nStatus]{
        evhttp_send_reply(req_copy, nStatus, nullptr, nullptr);
        // Re-enable reading from the socket. This is the second part of the libevent
        // workaround above.
        if (event_get_version_number() >= 0x02010600 && event_get_version_number() < 0x02010900) {
            evhttp_connection* conn = evhttp_request_get_connection(req_copy);
            if (conn) {
                bufferevent* bev = evhttp_connection_get_bufferevent(conn);
                if (bev) {
                    bufferevent_enable(bev, EV_READ | EV_WRITE);
                }
            }
        }
    });
    ev->trigger(nullptr);
    replySent = true;
    req = nullptr; // transferred back to main thread
}